

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O0

string * anon_unknown.dwarf_3ef85::getFuncName
                   (string *__return_storage_ptr__,string *name,size_t numArgs)

{
  ostream *poVar1;
  ulong local_1c0;
  size_t i;
  stringstream local_1a8 [8];
  stringstream stream;
  ostream local_198 [376];
  size_t local_20;
  size_t numArgs_local;
  string *name_local;
  
  local_20 = numArgs;
  numArgs_local = (size_t)name;
  name_local = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a8);
  poVar1 = std::operator<<(local_198,(string *)name);
  std::operator<<(poVar1,"(");
  for (local_1c0 = 0; local_1c0 < local_20; local_1c0 = local_1c0 + 1) {
    if (local_1c0 != 0) {
      std::operator<<(local_198,", ");
    }
    poVar1 = std::operator<<(local_198,"x");
    std::ostream::operator<<(poVar1,local_1c0);
  }
  std::operator<<(local_198,")");
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a8);
  return __return_storage_ptr__;
}

Assistant:

std::string getFuncName(std::string name, std::size_t numArgs) {
		std::stringstream stream;

		stream << name << "(";
		for (std::size_t i = 0; i < numArgs; i++) {
			if (i != 0) {
				stream << ", ";
			}

			stream << "x" << i;
		}

		stream << ")";

		return stream.str();
	}